

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O1

void ndn_unix_face_recv(void *self,size_t param_len,void *param)

{
  uint uVar1;
  ssize_t sVar2;
  uint8_t *puVar3;
  int *piVar4;
  ndn_msg *pnVar5;
  undefined4 uVar6;
  size_t buflen;
  uint8_t *puVar7;
  uint8_t *buf;
  uint32_t local_54;
  size_t sStack_50;
  uint32_t cur_type;
  uint8_t *local_48;
  void *local_40;
  uint local_34 [2];
  uint32_t cur_size;
  
  *(undefined8 *)((long)self + 0x98) = 0;
  uVar6 = 0;
  sStack_50 = param_len;
  sVar2 = recv(*(int *)((long)self + 0xa0),
               (void *)((long)self + (ulong)*(uint *)((long)self + 0x10a4) + 0xa4),
               0x1000 - (ulong)*(uint *)((long)self + 0x10a4),0);
  if (0 < sVar2) {
    puts("Some packets recved");
    if (0xa4 < (long)(sVar2 + (ulong)*(uint *)((long)self + 0x10a4) + 0xa4)) {
      buf = (uint8_t *)((long)self + 0xa4);
      puVar7 = (uint8_t *)((long)self + sVar2 + (ulong)*(uint *)((long)self + 0x10a4) + 0xa4);
      local_48 = buf;
      local_40 = param;
      do {
        buflen = (long)puVar7 - (long)buf;
        puVar3 = tlv_get_type_length(buf,buflen,&local_54,local_34);
        if (puVar3 == (uint8_t *)0x0) {
LAB_00116ad6:
          memcpy(local_48,buf,buflen);
          goto LAB_00116ae5;
        }
        local_34[0] = ((int)puVar3 - (int)buf) + local_34[0];
        if (puVar7 < buf + local_34[0]) goto LAB_00116ad6;
        uVar1 = ndn_forwarder_receive((ndn_face_intf_t *)self,buf,(ulong)local_34[0]);
        if (uVar1 != 0) {
          printf("forwarder receive fail, error code = %d\n",(ulong)uVar1);
        }
        buf = buf + local_34[0];
      } while (buf < puVar7);
      buflen = 0;
LAB_00116ae5:
      uVar6 = (undefined4)buflen;
      param = local_40;
    }
    *(undefined4 *)((long)self + 0x10a4) = uVar6;
LAB_00116af3:
    pnVar5 = ndn_msgqueue_post(self,ndn_unix_face_recv,sStack_50,param);
    *(ndn_msg **)((long)self + 0x98) = pnVar5;
    return;
  }
  if (sVar2 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == 0xb) goto LAB_00116af3;
  }
  (**(code **)((long)self + 0x10))();
  return;
}

Assistant:

static void
ndn_unix_face_recv(void *self, size_t param_len, void *param){
  ndn_unix_face_t* ptr = (ndn_unix_face_t*)self;
  ssize_t size;
  uint8_t *buf, *valptr;
  uint32_t cur_type, cur_size;

  // It works without this line but I think adding is better, following the logic.
  // So ndn_face_down won't cancel a not existing event.
  ptr->process_event = NULL;

  size = recv(ptr->sock,
              ptr->buf + ptr->offset,
              sizeof(ptr->buf) - ptr->offset,
              0);
  if(size > 0){
    printf("Some packets recved\n");
    // Some packets recved
    size += ptr->offset;
    for(buf = ptr->buf; buf < ptr->buf + size; buf += cur_size){
      valptr = tlv_get_type_length(buf, ptr->buf + size - buf, &cur_type, &cur_size);
      if(valptr == NULL){
        break;
      }
      cur_size += valptr - buf;
      if(buf + cur_size > ptr->buf + size){
        break;
      }
      int ret = ndn_forwarder_receive(&ptr->intf, buf, cur_size);
      if (ret != NDN_SUCCESS)
          printf("forwarder receive fail, error code = %d\n", ret);
    }
    if(buf < ptr->buf + size){
      // TODO: Too large packets will block the receive.
      memcpy(ptr->buf, buf, ptr->buf + size - buf);
      ptr->offset = ptr->buf + size - buf;
    }else{
      ptr->offset = 0;
    }
  }else if(size == -1 && errno == EWOULDBLOCK){
    // No more packet
  }else{
    // size == 0 means a shutdown
    ndn_face_down(&ptr->intf);
    return;
  }

  ptr->process_event = ndn_msgqueue_post(self, ndn_unix_face_recv, param_len, param);
}